

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void NavierStokesBase::Initialize(void)

{
  bool bVar1;
  int iVar2;
  ParmParse pp;
  int do_scalar_update_in_order;
  ParmParse pp2;
  ParmParse PStack_e8;
  int local_8c;
  string local_88;
  undefined1 local_68 [88];
  
  if ((anonymous_namespace)::initialized == '\0') {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"ns","");
    amrex::ParmParse::ParmParse(&PStack_e8,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    amrex::ParmParse::query(&PStack_e8,"dump_plane",&(anonymous_namespace)::dump_plane,0);
    amrex::ParmParse::query
              (&PStack_e8,"benchmarking",(bool *)&(anonymous_namespace)::benchmarking,0);
    amrex::ParmParse::query(&PStack_e8,"v",&verbose,0);
    amrex::ParmParse::get(&PStack_e8,"cfl",&cfl,0);
    amrex::ParmParse::query(&PStack_e8,"init_iter",&init_iter,0);
    amrex::ParmParse::query(&PStack_e8,"init_vel_iter",&init_vel_iter,0);
    amrex::ParmParse::query(&PStack_e8,"init_shrink",&init_shrink,0);
    amrex::ParmParse::query(&PStack_e8,"dt_cutoff",&dt_cutoff,0);
    amrex::ParmParse::query(&PStack_e8,"change_max",&change_max,0);
    amrex::ParmParse::query(&PStack_e8,"fixed_dt",&fixed_dt,0);
    amrex::ParmParse::query(&PStack_e8,"init_dt",&init_dt,0);
    amrex::ParmParse::query(&PStack_e8,"stop_when_steady",&stop_when_steady,0);
    amrex::ParmParse::query(&PStack_e8,"steady_tol",&steady_tol,0);
    amrex::ParmParse::query(&PStack_e8,"sum_interval",&sum_interval,0);
    amrex::ParmParse::query(&PStack_e8,"gravity",&gravity,0);
    amrex::ParmParse::query(&PStack_e8,"do_temp",&do_temp,0);
    amrex::ParmParse::query(&PStack_e8,"do_trac2",&do_trac2,0);
    amrex::ParmParse::query(&PStack_e8,"do_cons_trac",&do_cons_trac,0);
    amrex::ParmParse::query(&PStack_e8,"do_cons_trac2",&do_cons_trac2,0);
    amrex::ParmParse::query(&PStack_e8,"do_sync_proj",&do_sync_proj,0);
    amrex::ParmParse::query(&PStack_e8,"do_reflux",&do_reflux,0);
    amrex::ParmParse::query(&PStack_e8,"do_init_vort_proj",&do_init_vort_proj,0);
    amrex::ParmParse::query(&PStack_e8,"do_init_proj",&do_init_proj,0);
    amrex::ParmParse::query(&PStack_e8,"do_mac_proj",&do_mac_proj,0);
    amrex::ParmParse::query(&PStack_e8,"do_denminmax",&do_denminmax,0);
    amrex::ParmParse::query(&PStack_e8,"do_scalminmax",&do_scalminmax,0);
    bVar1 = amrex::ParmParse::contains(&PStack_e8,"do_temp_ref");
    if ((((bVar1) || (bVar1 = amrex::ParmParse::contains(&PStack_e8,"do_density_ref"), bVar1)) ||
        (bVar1 = amrex::ParmParse::contains(&PStack_e8,"do_tracer_ref"), bVar1)) ||
       ((bVar1 = amrex::ParmParse::contains(&PStack_e8,"do_tracer2_ref"), bVar1 ||
        (bVar1 = amrex::ParmParse::contains(&PStack_e8,"do_vorticity_ref"), bVar1)))) {
      amrex::Abort_host(
                       "ns.do_*_ref no longer supported. Refinement now implemented using refinement_indicators. For help, see UsersGuide or examples in /Exec"
                       );
    }
    amrex::ParmParse::query(&PStack_e8,"visc_tol",&visc_tol,0);
    amrex::ParmParse::query(&PStack_e8,"visc_abs_tol",&visc_abs_tol,0);
    amrex::ParmParse::query(&PStack_e8,"getForceVerbose",&getForceVerbose,0);
    amrex::ParmParse::query(&PStack_e8,"do_LES",&do_LES,0);
    amrex::ParmParse::query(&PStack_e8,"getLESVerbose",&getLESVerbose,0);
    amrex::ParmParse::query(&PStack_e8,"LES_model",&LES_model_abi_cxx11_,0);
    amrex::ParmParse::query(&PStack_e8,"smago_Cs_cst",&smago_Cs_cst,0);
    amrex::ParmParse::query(&PStack_e8,"sigma_Cs_cst",&sigma_Cs_cst,0);
    amrex::ParmParse::query(&PStack_e8,"avg_interval",&avg_interval,0);
    amrex::ParmParse::query(&PStack_e8,"compute_fluctuations",&compute_fluctuations,0);
    amrex::ParmParse::query(&PStack_e8,"refine_cutcells",&refine_cutcells,0);
    local_8c = 0;
    amrex::ParmParse::query(&PStack_e8,"do_scalar_update_in_order",&local_8c,0);
    if (local_8c != 0) {
      amrex::Abort_host(
                       "NavierStokesBase::Initialize(): do_scalar_update_in_order no longer supported. If needed, please open issue on github."
                       );
    }
    if (1.0 < init_shrink) {
      amrex::Abort_host("NavierStokesBase::Initialize(): init_shrink cannot be greater than 1");
    }
    amrex::ParmParse::query(&PStack_e8,"be_cn_theta",&be_cn_theta,0);
    if ((1.0 < be_cn_theta) || (be_cn_theta < 0.5)) {
      amrex::Abort_host("NavierStokesBase::Initialize(): Must have be_cn_theta <= 1.0 && >= .5");
    }
    amrex::ParmParse::query(&PStack_e8,"do_refine_outflow",&do_refine_outflow,0);
    amrex::ParmParse::query(&PStack_e8,"do_derefine_outflow",&do_derefine_outflow,0);
    if ((do_derefine_outflow == 1) && (do_refine_outflow == 1)) {
      amrex::Abort_host(
                       "NavierStokesBase::Initialize(): Cannot have both do_refine_outflow==1 and do_derefine_outflow==1"
                       );
    }
    amrex::ParmParse::query(&PStack_e8,"Nbuf_outflow",&Nbuf_outflow,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_origin_x",&volWgtSum_sub_origin_x,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_origin_y",&volWgtSum_sub_origin_y,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_origin_z",&volWgtSum_sub_origin_z,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_Rcyl",&volWgtSum_sub_Rcyl,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_dx",&volWgtSum_sub_dx,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_dy",&volWgtSum_sub_dy,0);
    amrex::ParmParse::query(&PStack_e8,"volWgtSum_sub_dz",&volWgtSum_sub_dz,0);
    amrex::ParmParse::query(&PStack_e8,"do_mom_diff",&do_mom_diff,0);
    amrex::ParmParse::query(&PStack_e8,"gradp_in_checkpoint",&gradp_in_checkpoint,0);
    amrex::ParmParse::query(&PStack_e8,"avg_in_checkpoint",&average_in_checkpoint,0);
    bVar1 = amrex::ParmParse::contains(&PStack_e8,"use_godunov");
    if (bVar1) {
      amrex::Abort_host(
                       "ns.use_godunov is depreciated. Please use ns.advection_scheme instead. Options are MOL, Godunov_PLM (default), Godunov_PPM"
                       );
    }
    amrex::ParmParse::query(&PStack_e8,"advection_scheme",&advection_scheme_abi_cxx11_,0);
    iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if ((((iVar2 != 0) &&
         (iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_), iVar2 != 0))
        && (iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_), iVar2 != 0)
        ) && (iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_),
             iVar2 != 0)) {
      amrex::Abort_host("Invalid advection_scheme. Options are MOL, Godunov_PLM, Godunov_PPM, BDS");
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"godunov","");
    amrex::ParmParse::ParmParse((ParmParse *)local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    amrex::ParmParse::query
              ((ParmParse *)local_68,"use_forces_in_trans",&godunov_use_forces_in_trans,0);
    iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if ((iVar2 == 0) ||
       (iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_), iVar2 == 0)) {
      amrex::Abort_host(
                       "this advection_scheme is not implemented for EB. Options are MOL or Godunov_PLM (default)"
                       );
    }
    if (godunov_use_forces_in_trans == true) {
      amrex::Abort_host(
                       "use_forces_in_trans not implemented within EB Godunov. Set godunov.use_forces_in_trans=0."
                       );
    }
    iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    if (iVar2 == 0) {
      amrex::Abort_host("BDS not implemented with Embedded Boundaries.");
    }
    amrex::ParmParse::query(&PStack_e8,"redistribution_type",&redistribution_type_abi_cxx11_,0);
    iVar2 = std::__cxx11::string::compare((char *)&redistribution_type_abi_cxx11_);
    if (((iVar2 != 0) &&
        (iVar2 = std::__cxx11::string::compare((char *)&redistribution_type_abi_cxx11_), iVar2 != 0)
        ) && (iVar2 = std::__cxx11::string::compare((char *)&redistribution_type_abi_cxx11_),
             iVar2 != 0)) {
      amrex::Abort_host("redistribution type must be NoRedist, FluxRedist, or StateRedist");
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x33fec6);
    (anonymous_namespace)::initialized = 1;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&PStack_e8);
    return;
  }
  return;
}

Assistant:

void
NavierStokesBase::Initialize ()
{
    if (initialized) {
        return;
    }

    ParmParse pp("ns");

    pp.query("dump_plane",dump_plane);

    pp.query("benchmarking",benchmarking);

    pp.query("v",verbose);


    //
    // Get timestepping parameters.
    //
    pp.get("cfl",cfl);
    pp.query("init_iter",init_iter);
    pp.query("init_vel_iter",init_vel_iter);
    pp.query("init_shrink",init_shrink);
    pp.query("dt_cutoff",dt_cutoff);
    pp.query("change_max",change_max);
    pp.query("fixed_dt",fixed_dt);
    pp.query("init_dt", init_dt);
    pp.query("stop_when_steady",stop_when_steady);
    pp.query("steady_tol",steady_tol);
    pp.query("sum_interval",sum_interval);
    pp.query("gravity",gravity);
    //
    // Get run options.
    //
    pp.query("do_temp",                  do_temp          );
    pp.query("do_trac2",                 do_trac2         );
    pp.query("do_cons_trac",             do_cons_trac     );
    pp.query("do_cons_trac2",            do_cons_trac2    );
    pp.query("do_sync_proj",             do_sync_proj     );
    pp.query("do_reflux",                do_reflux        );
    pp.query("do_init_vort_proj",        do_init_vort_proj);
    pp.query("do_init_proj",             do_init_proj     );
    pp.query("do_mac_proj",              do_mac_proj      );
    pp.query("do_denminmax",             do_denminmax     );
    pp.query("do_scalminmax",            do_scalminmax    );

    if ( pp.contains("do_temp_ref") ||
         pp.contains("do_density_ref") ||
         pp.contains("do_tracer_ref") ||
         pp.contains("do_tracer2_ref") ||
         pp.contains("do_vorticity_ref") ) {
        amrex::Abort("ns.do_*_ref no longer supported. Refinement now implemented using refinement_indicators. For help, see UsersGuide or examples in /Exec");
    }

    pp.query("visc_tol",visc_tol);
    pp.query("visc_abs_tol",visc_abs_tol);

    pp.query("getForceVerbose",          getForceVerbose  );
    pp.query("do_LES",                   do_LES  );
    pp.query("getLESVerbose",            getLESVerbose  );
    pp.query("LES_model",                LES_model  );
    pp.query("smago_Cs_cst",             smago_Cs_cst  );
    pp.query("sigma_Cs_cst",             sigma_Cs_cst  );

    pp.query("avg_interval",             avg_interval  );
    pp.query("compute_fluctuations",     compute_fluctuations  );

#ifdef AMREX_USE_EB
    pp.query("refine_cutcells", refine_cutcells);
#endif

    int do_scalar_update_in_order = 0;
    pp.query("do_scalar_update_in_order",do_scalar_update_in_order );
    if (do_scalar_update_in_order) {
        amrex::Abort("NavierStokesBase::Initialize(): do_scalar_update_in_order no longer supported. If needed, please open issue on github.");
    }

    // Don't let init_shrink be greater than 1
    if (init_shrink > 1.0) {
        amrex::Abort("NavierStokesBase::Initialize(): init_shrink cannot be greater than 1");
    }

    pp.query("be_cn_theta",be_cn_theta);
    if (be_cn_theta > 1.0 || be_cn_theta < .5) {
        amrex::Abort("NavierStokesBase::Initialize(): Must have be_cn_theta <= 1.0 && >= .5");
    }
    //
    // Set parameters dealing with how grids are treated at outflow boundaries.
    //
    pp.query("do_refine_outflow",do_refine_outflow);
    pp.query("do_derefine_outflow",do_derefine_outflow);
    if (do_derefine_outflow == 1 && do_refine_outflow == 1) {
      amrex::Abort("NavierStokesBase::Initialize(): Cannot have both do_refine_outflow==1 and do_derefine_outflow==1");
    }

    pp.query("Nbuf_outflow",Nbuf_outflow);
    AMREX_ASSERT(Nbuf_outflow >= 0);
    AMREX_ASSERT(!(Nbuf_outflow <= 0 && do_derefine_outflow == 1));

    // If dx,dy,dz,Rcyl<0 (default) the volWgtSum is computed over the entire domain
    pp.query("volWgtSum_sub_origin_x",volWgtSum_sub_origin_x);
    pp.query("volWgtSum_sub_origin_y",volWgtSum_sub_origin_y);
    pp.query("volWgtSum_sub_origin_z",volWgtSum_sub_origin_z);
    pp.query("volWgtSum_sub_Rcyl",volWgtSum_sub_Rcyl);
    pp.query("volWgtSum_sub_dx",volWgtSum_sub_dx);
    pp.query("volWgtSum_sub_dy",volWgtSum_sub_dy);
    pp.query("volWgtSum_sub_dz",volWgtSum_sub_dz);

    // Are we going to do velocity or momentum update?
    pp.query("do_mom_diff",do_mom_diff);

#ifdef AMREX_PARTICLES
    read_particle_params ();
#endif

    //
    // Get checkpoint info
    //
    pp.query("gradp_in_checkpoint", gradp_in_checkpoint);
    pp.query("avg_in_checkpoint",   average_in_checkpoint);

    //
    // Get advection scheme options
    //
    if ( pp.contains("use_godunov") ) {
        Abort("ns.use_godunov is depreciated. Please use ns.advection_scheme instead. Options are MOL, Godunov_PLM (default), Godunov_PPM"); // Godunov_BDS");
    }

    pp.query("advection_scheme", advection_scheme);
    if ( advection_scheme != "MOL" && advection_scheme != "Godunov_PLM" && advection_scheme != "Godunov_PPM" && advection_scheme != "BDS") {
        Abort("Invalid advection_scheme. Options are MOL, Godunov_PLM, Godunov_PPM, BDS");
    }

    ParmParse pp2("godunov");
    pp2.query("use_forces_in_trans", godunov_use_forces_in_trans);

#ifdef AMREX_USE_EB
    //
    // EB Godunov restrictions
    //
    if ( advection_scheme == "Godunov_PPM" || advection_scheme == "BDS") {
        amrex::Abort("this advection_scheme is not implemented for EB. Options are MOL or Godunov_PLM (default)");
    }
    if ( godunov_use_forces_in_trans ) {
        amrex::Abort("use_forces_in_trans not implemented within EB Godunov. Set godunov.use_forces_in_trans=0.");
    }

    //
    // BDS restrictions
    //
    if (advection_scheme == "BDS"){
        amrex::Abort("BDS not implemented with Embedded Boundaries.");
    }

    //
    // Redistribution
    //
    pp.query("redistribution_type", redistribution_type);
    if (redistribution_type != "NoRedist" &&
        redistribution_type != "FluxRedist" &&
        redistribution_type != "StateRedist" ) {
        amrex::Abort("redistribution type must be NoRedist, FluxRedist, or StateRedist");
    }
#endif

    amrex::ExecOnFinalize(NavierStokesBase::Finalize);

    initialized = true;
}